

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O3

FStateLabels *
FStateDefinitions::CreateStateLabelList(TArray<FStateDefine,_FStateDefine> *statelist)

{
  int *piVar1;
  FStateDefine *pFVar2;
  bool bVar3;
  uint uVar4;
  FStateLabels *pFVar5;
  FStateLabels *pFVar6;
  FStateLabels **ppFVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  
  uVar9 = statelist->Count;
  uVar4 = uVar9 - 1;
  if (-1 < (int)uVar4) {
    lVar10 = (ulong)uVar4 * 0x28 + 0x18;
    uVar8 = (ulong)uVar4;
    do {
      pFVar2 = statelist->Array;
      if ((*(int *)((long)pFVar2 + lVar10 + -0x18) == 0) ||
         ((*(long *)((long)&(pFVar2->Label).Index + lVar10) == 0 &&
          (*(int *)((long)pFVar2 + lVar10 + -4) == 0)))) {
        TArray<FStateDefine,_FStateDefine>::Delete(statelist,(uint)uVar8);
      }
      lVar10 = lVar10 + -0x28;
      bVar3 = 0 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar3);
    uVar9 = statelist->Count;
  }
  if (uVar9 == 0) {
    pFVar5 = (FStateLabels *)0x0;
  }
  else {
    pFVar5 = (FStateLabels *)
             M_Malloc_Dbg((long)(int)(uVar9 - 1) * 0x18 + 0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_states.cpp"
                          ,0x1de);
    pFVar5->NumLabels = uVar9;
    if (0 < (int)uVar9) {
      lVar10 = 0;
      pFVar6 = pFVar5;
      do {
        ppFVar7 = &pFVar6->Labels[0].Children;
        piVar1 = (int *)((long)&(statelist->Array->Label).Index + lVar10);
        pFVar6->Labels[0].Label.Index = *piVar1;
        pFVar6->Labels[0].State = *(FState **)(piVar1 + 6);
        pFVar6 = CreateStateLabelList((TArray<FStateDefine,_FStateDefine> *)(piVar1 + 2));
        *ppFVar7 = pFVar6;
        lVar10 = lVar10 + 0x28;
        pFVar6 = (FStateLabels *)ppFVar7;
      } while ((ulong)uVar9 * 0x28 != lVar10);
    }
    qsort(pFVar5->Labels,(long)(int)uVar9,0x18,labelcmp);
  }
  return pFVar5;
}

Assistant:

FStateLabels *FStateDefinitions::CreateStateLabelList(TArray<FStateDefine> & statelist)
{
	// First delete all empty labels from the list
	for (int i = statelist.Size() - 1; i >= 0; i--)
	{
		if (statelist[i].Label == NAME_None || (statelist[i].State == NULL && statelist[i].Children.Size() == 0))
		{
			statelist.Delete(i);
		}
	}

	int count = statelist.Size();

	if (count == 0)
	{
		return NULL;
	}
	FStateLabels *list = (FStateLabels*)M_Malloc(sizeof(FStateLabels)+(count-1)*sizeof(FStateLabel));
	list->NumLabels = count;

	for (int i=0;i<count;i++)
	{
		list->Labels[i].Label = statelist[i].Label;
		list->Labels[i].State = statelist[i].State;
		list->Labels[i].Children = CreateStateLabelList(statelist[i].Children);
	}
	qsort(list->Labels, count, sizeof(FStateLabel), labelcmp);
	return list;
}